

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_ref_t
flatcc_builder_embed_buffer
          (flatcc_builder_t *B,uint16_t block_align,void *data,size_t size,uint16_t align,
          flatcc_builder_buffer_flags_t flags)

{
  int iVar1;
  undefined1 auStack_d0 [4];
  int with_size;
  flatcc_iov_state_t iov;
  undefined1 local_38 [4];
  flatbuffers_uoffset_t pad;
  flatbuffers_uoffset_t size_field;
  flatcc_builder_buffer_flags_t flags_local;
  uint16_t align_local;
  size_t size_local;
  void *data_local;
  flatcc_builder_t *pfStack_18;
  uint16_t block_align_local;
  flatcc_builder_t *B_local;
  
  pad._0_2_ = flags;
  pad._2_2_ = align;
  _size_field = (void *)size;
  size_local = (size_t)data;
  data_local._6_2_ = block_align;
  pfStack_18 = B;
  iVar1 = align_buffer_end(B,(uint16_t *)((long)&pad + 2),block_align,
                           (uint)((B->nest_id == 0 ^ 0xffU) & 1));
  if (iVar1 == 0) {
    iVar1 = 0;
    if ((flags & 2) != 0) {
      iVar1 = 4;
    }
    iov.iov[7].iov_len._4_4_ = front_pad(pfStack_18,(int)_size_field + iVar1,pad._2_2_);
    __flatbuffers_uoffset_write_to_pe(local_38,(int)_size_field + iov.iov[7].iov_len._4_4_);
    _auStack_d0 = 0;
    iov.len._0_1_ = pfStack_18->nest_id != 0;
    if (iov.len._0_1_) {
      _auStack_d0 = 4;
      iov._8_8_ = local_38;
      iov.iov[0].iov_base = (void *)0x4;
    }
    iov.len._1_3_ = 0;
    if (_size_field != (void *)0x0) {
      _auStack_d0 = (long)_size_field + _auStack_d0;
      iov.iov[(long)(int)(uint)iov.len + -1].iov_len = size_local;
      iov.iov[(int)(uint)iov.len].iov_base = _size_field;
      iov.len._0_4_ = (uint)iov.len + 1;
    }
    if (iov.iov[7].iov_len._4_4_ != 0) {
      _auStack_d0 = iov.iov[7].iov_len._4_4_ + _auStack_d0;
      iov.iov[(long)(int)(uint)iov.len + -1].iov_len = (size_t)"";
      iov.iov[(int)(uint)iov.len].iov_base = (void *)(ulong)iov.iov[7].iov_len._4_4_;
      iov.len._0_4_ = (uint)iov.len + 1;
    }
    B_local._4_4_ = emit_front(pfStack_18,(flatcc_iov_state_t *)auStack_d0);
  }
  else {
    B_local._4_4_ = 0;
  }
  return B_local._4_4_;
}

Assistant:

flatcc_builder_ref_t flatcc_builder_embed_buffer(flatcc_builder_t *B,
        uint16_t block_align,
        const void *data, size_t size, uint16_t align, flatcc_builder_buffer_flags_t flags)
{
    uoffset_t size_field, pad;
    iov_state_t iov;
    int with_size = (flags & flatcc_builder_with_size) != 0;

    if (align_buffer_end(B, &align, block_align, !is_top_buffer(B))) {
        return 0;
    }
    pad = front_pad(B, (uoffset_t)(size + (with_size ? field_size : 0)), align);
    write_uoffset(&size_field, (uoffset_t)size + pad);
    init_iov();
    /* Add ubyte vector size header if nested buffer. */
    push_iov_cond(&size_field, field_size, !is_top_buffer(B));
    push_iov(data, size);
    push_iov(_pad, pad);
    return emit_front(B, &iov);
}